

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::scan
               (DAEScanner *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  SIMDExtract *pSVar2;
  ArrayInit *pAVar3;
  SIMDLoad *pSVar4;
  GlobalSet *pGVar5;
  AtomicCmpxchg *pAVar6;
  Return *pRVar7;
  MemoryCopy *pMVar8;
  AtomicWait *pAVar9;
  TupleMake *pTVar10;
  Load *pLVar11;
  CallRef *pCVar12;
  Call *pCVar13;
  StructNew *pSVar14;
  ArrayNew *pAVar15;
  ArrayNewFixed *pAVar16;
  Expression **ppEVar17;
  Break *pBVar18;
  Switch *pSVar19;
  CallIndirect *pCVar20;
  Try *pTVar21;
  Store *pSVar22;
  Throw *pTVar23;
  MemoryGrow *pMVar24;
  Name *currp_00;
  PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *pPVar25;
  ulong uVar26;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitBlock,currp)
    ;
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar26 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    return;
  case IfId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitIf,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::maybePushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pMVar8->size);
    goto LAB_0081e3ac;
  case LoopId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitLoop,currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_0081debc;
  case BreakId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitBreak,currp)
    ;
    pBVar18 = Expression::cast<wasm::Break>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::maybePushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pBVar18->condition);
    ppEVar17 = &pBVar18->value;
    goto LAB_0081de8e;
  case SwitchId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitSwitch,currp
              );
    pSVar19 = Expression::cast<wasm::Switch>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pSVar19->condition);
    ppEVar17 = &pSVar19->value;
    goto LAB_0081de8e;
  case CallId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitCall,currp);
    pCVar13 = Expression::cast<wasm::Call>(this);
    uVar26 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    return;
  case CallIndirectId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitCallIndirect
               ,currp);
    pCVar20 = Expression::cast<wasm::CallIndirect>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pCVar20->target);
    uVar26 = (ulong)(uint)(pCVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar20->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    return;
  case LocalGetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitLocalGet,
               currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitLocalSet,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_0081e220;
  case GlobalGetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitGlobalGet,
               currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitGlobalSet,
               currp);
    pGVar5 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_0081debc;
  case LoadId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitLoad,currp);
    pLVar11 = Expression::cast<wasm::Load>(this);
    ppEVar17 = &pLVar11->ptr;
    goto LAB_0081e449;
  case StoreId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStore,currp)
    ;
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_0081e1e3;
  case ConstId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitConst,currp)
    ;
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitUnary,currp)
    ;
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_0081e220;
  case BinaryId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitBinary,currp
              );
    pAVar9 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_0081e423;
  case SelectId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitSelect,currp
              );
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_0081df24;
  case DropId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitDrop,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::Drop>(this);
    break;
  case ReturnId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitReturn,currp
              );
    pRVar7 = Expression::cast<wasm::Return>(this);
    ppEVar17 = &pRVar7->value;
    goto LAB_0081de8e;
  case MemorySizeId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitMemoryGrow,
               currp);
    pMVar24 = Expression::cast<wasm::MemoryGrow>(this);
    break;
  case NopId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitAtomicRMW,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_0081e2aa;
  case AtomicCmpxchgId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitAtomicCmpxchg,currp);
    pAVar6 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_0081e28d;
  case AtomicWaitId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitAtomicWait,
               currp);
    pAVar9 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_0081dba1;
  case AtomicNotifyId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitAtomicNotify
               ,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_0081e423;
  case AtomicFenceId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar2 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_0081e220;
  case SIMDReplaceId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitSIMDReplace,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    currp_00 = (Name *)&pAVar9->timeout;
    goto LAB_0081e431;
  case SIMDShuffleId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitSIMDShuffle,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_0081e3ac;
  case SIMDTernaryId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitSIMDTernary,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_0081dba1;
  case SIMDShiftId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitSIMDShift,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_0081e423;
  case SIMDLoadId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitSIMDLoad,
               currp);
    pSVar4 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_0081e09c;
  case SIMDLoadStoreLaneId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_0081e1e3:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               &pSVar22->value);
    ppEVar17 = &pSVar22->ptr;
    goto LAB_0081e449;
  case MemoryInitId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitMemoryInit,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
LAB_0081e28d:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               (Expression **)&pAVar6->replacement);
    goto LAB_0081e2aa;
  case DataDropId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitDataDrop,
               currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitMemoryCopy,
               currp);
    pMVar8 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_0081df24;
  case MemoryFillId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitMemoryFill,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_0081df24;
  case PopId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitRefNull,
               currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitRefIsNull,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefIsNull>(this);
    break;
  case RefFuncId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitRefFunc,
               currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitRefEq,currp)
    ;
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_0081e3ac;
  case TableGetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitTableGet,
               currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_0081debc:
    ppEVar17 = &pGVar5->value;
    goto LAB_0081e449;
  case TableSetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitTableSet,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_0081e2aa;
  case TableSizeId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitTableSize,
               currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitTableGrow,
               currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
LAB_0081e2aa:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               &pAVar6->expected);
    ppEVar17 = &pAVar6->ptr;
    goto LAB_0081e449;
  case TryId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitTry,currp);
    pTVar21 = Expression::cast<wasm::Try>(this);
    uVar26 = (ulong)(uint)(pTVar21->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar21->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    ppEVar17 = &pTVar21->body;
    goto LAB_0081e449;
  case ThrowId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitThrow,currp)
    ;
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar26 = (ulong)(uint)(pTVar23->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar23->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    return;
  case RethrowId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitRethrow,
               currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case TupleMakeId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitTupleMake,
               currp);
    pTVar10 = Expression::cast<wasm::TupleMake>(this);
    uVar26 = (ulong)(uint)(pTVar10->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar10->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    return;
  case TupleExtractId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitTupleExtract
               ,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::TupleExtract>(this);
    break;
  case I31NewId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitI31New,currp
              );
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31New>(this);
    break;
  case I31GetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitI31Get,currp
              );
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31Get>(this);
    break;
  case CallRefId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitCallRef,
               currp);
    pCVar12 = Expression::cast<wasm::CallRef>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pCVar12->target);
    uVar26 = (ulong)(uint)(pCVar12->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar12->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    return;
  case RefTestId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitRefTest,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefTest>(this);
    break;
  case RefCastId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitRefCast,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefCast>(this);
    break;
  case BrOnId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitBrOn,currp);
    pSVar4 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_0081e09c:
    ppEVar17 = &pSVar4->ptr;
    goto LAB_0081e449;
  case StructNewId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStructNew,
               currp);
    pSVar14 = Expression::cast<wasm::StructNew>(this);
    uVar26 = (ulong)(uint)(pSVar14->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar14->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    return;
  case StructGetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStructGet,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_0081e220;
  case StructSetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStructSet,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_0081e423;
  case ArrayNewId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitArrayNew,
               currp);
    pAVar15 = Expression::cast<wasm::ArrayNew>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pAVar15->size);
    ppEVar17 = &pAVar15->init;
LAB_0081de8e:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::maybePushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,ppEVar17
              );
    return;
  case ArrayNewSegId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitArrayNewSeg,
               currp);
    pAVar3 = (ArrayInit *)Expression::cast<wasm::ArrayNewSeg>(this);
    goto LAB_0081dd41;
  case ArrayNewFixedId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitArrayNewFixed,currp);
    pAVar16 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar26 = (ulong)(uint)(pAVar16->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar16->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
                (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
                 scan,ppEVar17);
    }
    return;
  case ArrayGetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitArrayGet,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_0081e3ac;
  case ArraySetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitArraySet,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_0081df24;
  case ArrayLenId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitArrayLen,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::ArrayLen>(this);
    break;
  case ArrayCopyId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitArrayCopy,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,(Expression **)&(pMVar8->destMemory).super_IString.str._M_str);
    goto LAB_0081db52;
  case ArrayFillId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitArrayFill,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_0081db52:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               (Expression **)&pMVar8->destMemory);
    goto LAB_0081df24;
  case ArrayInitId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitArrayInit,
               currp);
    pAVar3 = Expression::cast<wasm::ArrayInit>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pAVar3->size);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pAVar3->offset);
LAB_0081dd41:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               &pAVar3->index);
    ppEVar17 = &pAVar3->ref;
    goto LAB_0081e449;
  case RefAsId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitRefAs,currp)
    ;
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_0081e220;
  case StringNewId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStringNew,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::maybePushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,(Expression **)&pAVar9->expectedType);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::maybePushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pAVar9->timeout);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::maybePushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,&pAVar9->expected);
    goto LAB_0081e43c;
  case StringConstId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitStringMeasure,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
    goto LAB_0081e220;
  case StringEncodeId:
    pPVar25 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>;
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStringEncode
               ,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::maybePushTask
              (&pPVar25->super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan
               ,(Expression **)&pAVar9->timeout);
    goto LAB_0081e038;
  case StringConcatId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStringConcat
               ,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_0081e3ac;
  case StringEqId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStringEq,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
    goto LAB_0081e423;
  case StringAsId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::doVisitStringAs,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringAs>(this);
LAB_0081e220:
    ppEVar17 = &pSVar2->vec;
    goto LAB_0081e449;
  case StringWTF8AdvanceId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitStringWTF8Advance,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF8Advance>(this);
LAB_0081df24:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               &pMVar8->size);
    goto LAB_0081e3ac;
  case StringWTF16GetId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitStringWTF16Get,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_0081e3ac;
  case StringIterNextId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitStringIterNext,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::StringIterNext>(this);
    break;
  case StringIterMoveId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitStringIterMove,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringIterMove>(this);
LAB_0081e423:
    currp_00 = (Name *)&pAVar9->expected;
LAB_0081e431:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               (Expression **)currp_00);
LAB_0081e43c:
    ppEVar17 = &pAVar9->ptr;
    goto LAB_0081e449;
  case StringSliceWTFId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitStringSliceWTF,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_0081dba1:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               (Expression **)&pAVar9->timeout);
LAB_0081e038:
    currp_00 = (Name *)&pAVar9->expected;
    goto LAB_0081e431;
  case StringSliceIterId:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,
               Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::
               doVisitStringSliceIter,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringSliceIter>(this);
LAB_0081e3ac:
    Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,
               &pMVar8->source);
    ppEVar17 = &pMVar8->dest;
    goto LAB_0081e449;
  default:
    return;
  }
  ppEVar17 = &pMVar24->delta;
LAB_0081e449:
  Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::pushTask
            (&(self->
              super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
              ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
              super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>,scan,ppEVar17);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }